

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationGeometryGridRenderTests.cpp
# Opt level: O1

void __thiscall
vkt::tessellation::anon_unknown_1::GridRenderTestCase::GridRenderTestCase
          (GridRenderTestCase *this,TestContext *testCtx,string *name,string *description,
          Flags flags)

{
  ostringstream *poVar1;
  char *__s;
  uint uVar2;
  size_t sVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  MessageBuilder msg;
  undefined1 local_1a8 [384];
  
  tcu::TestCase::TestCase
            ((TestCase *)this,testCtx,(name->_M_dataplus)._M_p,(description->_M_dataplus)._M_p);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TestCase_00d2f7a8;
  this->m_flags = flags;
  iVar6 = 0x40;
  if ((flags & 1) == 0) {
    iVar6 = 5;
  }
  this->m_tessGenLevel = iVar6;
  iVar6 = 0x20;
  if ((flags & 4) == 0) {
    iVar6 = 4;
  }
  this->m_numGeometryInvocations = iVar6;
  iVar6 = 8;
  if ((flags & 0x40) == 0) {
    iVar6 = 1;
  }
  this->m_numLayers = iVar6;
  local_1a8._0_8_ = testCtx->m_log;
  poVar1 = (ostringstream *)(local_1a8 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,
             "Testing tessellation and geometry shaders that output a large number of primitives.\n"
             ,0x54);
  __s = (this->super_TestCase).super_TestCase.super_TestNode.m_description._M_dataplus._M_p;
  if (__s == (char *)0x0) {
    std::ios::clear((int)poVar1 + (int)*(undefined8 *)(local_1a8._8_8_ + -0x18));
  }
  else {
    sVar3 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,__s,sVar3);
  }
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x78));
  if ((this->m_flags & 0x40) != 0) {
    local_1a8._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1a8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Rendering to 2d texture array, numLayers = ",0x2b);
    std::ostream::operator<<(poVar1,this->m_numLayers);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x78));
  }
  local_1a8._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_1a8 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Tessellation level: ",0x14);
  std::ostream::operator<<(poVar1,this->m_tessGenLevel);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", mode = quad.\n",0xf);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"\tEach input patch produces ",0x1b);
  std::ostream::operator<<(poVar1,this->m_tessGenLevel * this->m_tessGenLevel);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," (",2);
  std::ostream::operator<<(poVar1,this->m_tessGenLevel * this->m_tessGenLevel * 2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," triangles)\n",0xc);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x78));
  uVar4 = 0x10;
  if ((this->m_flags & 2) != 0) {
    local_1a8._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1a8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Using geometry shader minimum maximum output limits.",0x34);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x78));
    uVar4 = 0x100;
  }
  if ((this->m_flags & 6) != 0) {
    local_1a8._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1a8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Geometry shader, targeting following limits:\n",0x2d);
    if ((this->m_flags & 2) != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"\tmaxGeometryOutputComponents = ",0x1f);
      std::ostream::operator<<(poVar1,0x40);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"\tmaxGeometryOutputVertices = ",0x1d);
      std::ostream::operator<<(poVar1,uVar4);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"\tmaxGeometryTotalOutputComponents = ",0x24);
      std::ostream::operator<<(poVar1,0x400);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\n",1);
    }
    if ((this->m_flags & 4) != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"\tmaxGeometryShaderInvocations = ",0x20);
      std::ostream::operator<<(poVar1,this->m_numGeometryInvocations);
    }
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x78));
  }
  if ((this->m_flags & 0x20) == 0) {
    uVar2 = 0x40;
    if (uVar4 >> 1 < 0x40) {
      uVar2 = uVar4 >> 1;
    }
    iVar6 = uVar2 * 2;
    this->m_numGeometryPrimitivesPerInvocation = uVar2 * 2 + -2;
  }
  else {
    uVar2 = 0x20;
    if (uVar4 >> 2 < 0x20) {
      uVar2 = uVar4 >> 2;
    }
    this->m_numGeometryPrimitivesPerInvocation = uVar2;
    iVar6 = uVar2 << 2;
  }
  iVar7 = this->m_numGeometryInvocations;
  iVar5 = this->m_numGeometryPrimitivesPerInvocation * iVar7;
  local_1a8._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_1a8 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Geometry shader:\n",0x11);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"\tTotal output vertex count per invocation: ",0x2b);
  std::ostream::operator<<(poVar1,iVar6);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"\tTotal output primitive count per invocation: ",0x2e);
  std::ostream::operator<<(poVar1,this->m_numGeometryPrimitivesPerInvocation);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"\tNumber of invocations per primitive: ",0x26);
  std::ostream::operator<<(poVar1,this->m_numGeometryInvocations);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"\tTotal output vertex count per input primitive: ",0x30);
  iVar7 = iVar7 * iVar6;
  std::ostream::operator<<(poVar1,iVar7);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"\tTotal output primitive count per input primitive: ",0x33);
  std::ostream::operator<<(poVar1,iVar5);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\n",1);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x78));
  local_1a8._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_1a8 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Program:\n",9);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"\tTotal program output vertices count per input patch: ",0x36);
  std::ostream::operator<<(poVar1,iVar7 * this->m_tessGenLevel * this->m_tessGenLevel * 2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"\tTotal program output primitive count per input patch: ",0x37);
  std::ostream::operator<<(poVar1,iVar5 * this->m_tessGenLevel * this->m_tessGenLevel * 2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\n",1);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x78));
  return;
}

Assistant:

GridRenderTestCase::GridRenderTestCase (tcu::TestContext& testCtx, const std::string& name, const std::string& description, const Flags flags)
	: TestCase					(testCtx, name, description)
	, m_flags					(flags)
	, m_tessGenLevel			((m_flags & FLAG_TESSELLATION_MAX_SPEC)			? 64 : 5)
	, m_numGeometryInvocations	((m_flags & FLAG_GEOMETRY_INVOCATIONS_MAX_SPEC)	? 32 : 4)
	, m_numLayers				((m_flags & FLAG_GEOMETRY_SCATTER_LAYERS)		? 8  : 1)
{
	DE_ASSERT(((flags & (FLAG_GEOMETRY_SCATTER_PRIMITIVES | FLAG_GEOMETRY_SCATTER_LAYERS)) != 0) == ((flags & FLAG_GEOMETRY_SEPARATE_PRIMITIVES) != 0));

	testCtx.getLog()
		<< tcu::TestLog::Message
		<< "Testing tessellation and geometry shaders that output a large number of primitives.\n"
		<< getDescription()
		<< tcu::TestLog::EndMessage;

	if (m_flags & FLAG_GEOMETRY_SCATTER_LAYERS)
		m_testCtx.getLog() << tcu::TestLog::Message << "Rendering to 2d texture array, numLayers = " << m_numLayers << tcu::TestLog::EndMessage;

	m_testCtx.getLog()
		<< tcu::TestLog::Message
		<< "Tessellation level: " << m_tessGenLevel << ", mode = quad.\n"
		<< "\tEach input patch produces " << (m_tessGenLevel*m_tessGenLevel) << " (" << (m_tessGenLevel*m_tessGenLevel*2) << " triangles)\n"
		<< tcu::TestLog::EndMessage;

	int geometryOutputComponents	  = 0;
	int geometryOutputVertices		  = 0;
	int geometryTotalOutputComponents = 0;

	if (m_flags & FLAG_GEOMETRY_MAX_SPEC)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Using geometry shader minimum maximum output limits." << tcu::TestLog::EndMessage;

		geometryOutputComponents	  = 64;
		geometryOutputVertices		  = 256;
		geometryTotalOutputComponents = 1024;
	}
	else
	{
		geometryOutputComponents	  = 64;
		geometryOutputVertices		  = 16;
		geometryTotalOutputComponents = 1024;
	}

	if ((m_flags & FLAG_GEOMETRY_MAX_SPEC) || (m_flags & FLAG_GEOMETRY_INVOCATIONS_MAX_SPEC))
	{
		tcu::MessageBuilder msg(&m_testCtx.getLog());

		msg << "Geometry shader, targeting following limits:\n";

		if (m_flags & FLAG_GEOMETRY_MAX_SPEC)
			msg	<< "\tmaxGeometryOutputComponents = "	   << geometryOutputComponents << "\n"
				<< "\tmaxGeometryOutputVertices = "		   << geometryOutputVertices << "\n"
				<< "\tmaxGeometryTotalOutputComponents = " << geometryTotalOutputComponents << "\n";

		if (m_flags & FLAG_GEOMETRY_INVOCATIONS_MAX_SPEC)
			msg << "\tmaxGeometryShaderInvocations = "	   << m_numGeometryInvocations;

		msg << tcu::TestLog::EndMessage;
	}

	const bool	separatePrimitives				  = (m_flags & FLAG_GEOMETRY_SEPARATE_PRIMITIVES) != 0;
	const int	numComponentsPerVertex			  = 8; // vec4 pos, vec4 color
	int			numVerticesPerInvocation		  = 0;
	int			geometryVerticesPerPrimitive	  = 0;
	int			geometryPrimitivesOutPerPrimitive = 0;

	if (separatePrimitives)
	{
		const int	numComponentLimit		 = geometryTotalOutputComponents / (4 * numComponentsPerVertex);
		const int	numOutputLimit			 = geometryOutputVertices / 4;

		m_numGeometryPrimitivesPerInvocation = de::min(numComponentLimit, numOutputLimit);
		numVerticesPerInvocation			 = m_numGeometryPrimitivesPerInvocation * 4;
	}
	else
	{
		// If FLAG_GEOMETRY_SEPARATE_PRIMITIVES is not set, geometry shader fills a rectangle area in slices.
		// Each slice is a triangle strip and is generated by a single shader invocation.
		// One slice with 4 segment ends (nodes) and 3 segments:
		//    .__.__.__.
		//    |\ |\ |\ |
		//    |_\|_\|_\|

		const int	numSliceNodesComponentLimit	= geometryTotalOutputComponents / (2 * numComponentsPerVertex);			// each node 2 vertices
		const int	numSliceNodesOutputLimit	= geometryOutputVertices / 2;											// each node 2 vertices
		const int	numSliceNodes				= de::min(numSliceNodesComponentLimit, numSliceNodesOutputLimit);

		numVerticesPerInvocation				= numSliceNodes * 2;
		m_numGeometryPrimitivesPerInvocation	= (numSliceNodes - 1) * 2;
	}

	geometryVerticesPerPrimitive	  = numVerticesPerInvocation * m_numGeometryInvocations;
	geometryPrimitivesOutPerPrimitive = m_numGeometryPrimitivesPerInvocation * m_numGeometryInvocations;

	m_testCtx.getLog()
		<< tcu::TestLog::Message
		<< "Geometry shader:\n"
		<< "\tTotal output vertex count per invocation: "		  << numVerticesPerInvocation << "\n"
		<< "\tTotal output primitive count per invocation: "	  << m_numGeometryPrimitivesPerInvocation << "\n"
		<< "\tNumber of invocations per primitive: "			  << m_numGeometryInvocations << "\n"
		<< "\tTotal output vertex count per input primitive: "	  << geometryVerticesPerPrimitive << "\n"
		<< "\tTotal output primitive count per input primitive: " << geometryPrimitivesOutPerPrimitive << "\n"
		<< tcu::TestLog::EndMessage;

	m_testCtx.getLog()
		<< tcu::TestLog::Message
		<< "Program:\n"
		<< "\tTotal program output vertices count per input patch: "  << (m_tessGenLevel*m_tessGenLevel*2 * geometryVerticesPerPrimitive) << "\n"
		<< "\tTotal program output primitive count per input patch: " << (m_tessGenLevel*m_tessGenLevel*2 * geometryPrimitivesOutPerPrimitive) << "\n"
		<< tcu::TestLog::EndMessage;
}